

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool __thiscall AActor::SuggestMissileAttack(AActor *this,double dist)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  TFlags<ActorFlag4,_unsigned_int> local_28;
  int mmc;
  double local_20;
  double dist_local;
  AActor *this_local;
  
  if ((this->maxtargetrange <= 0.0) || (dist < this->maxtargetrange || dist == this->maxtargetrange)
     ) {
    if ((this->MeleeState == (FState *)0x0) || (this->meleethreshold <= dist)) {
      local_20 = dist;
      dist_local = (double)this;
      TFlags<ActorFlag4,_unsigned_int>::operator&
                ((TFlags<ActorFlag4,_unsigned_int> *)&mmc,
                 (int)this + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&mmc);
      if (uVar2 != 0) {
        local_20 = local_20 * 0.5;
      }
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_28,
                 (int)this + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_28);
      if (uVar2 != 0) {
        local_20 = local_20 * 0.125;
      }
      bVar1 = this->MinMissileChance;
      dVar5 = G_SkillProperty(SKILLP_Aggressiveness);
      iVar3 = FRandom::operator()(&pr_checkmissilerange);
      iVar4 = MIN<int>((int)local_20,(int)((double)bVar1 * dVar5));
      this_local._7_1_ = iVar4 <= iVar3;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::SuggestMissileAttack (double dist)
{
	// new version encapsulates the different behavior in flags instead of virtual functions
	// The advantage is that this allows inheriting the missile attack attributes from the
	// various Doom monsters by custom monsters
	
	if (maxtargetrange > 0 && dist > maxtargetrange)
		return false;	// The Arch Vile's special behavior turned into a property
		
	if (MeleeState != NULL && dist < meleethreshold)
		return false;	// From the Revenant: close enough for fist attack

	if (flags4 & MF4_MISSILEMORE) dist *= 0.5;
	if (flags4 & MF4_MISSILEEVENMORE) dist *= 0.125;
	
	int mmc = int(MinMissileChance * G_SkillProperty(SKILLP_Aggressiveness));
	return pr_checkmissilerange() >= MIN<int> (int(dist), mmc);
}